

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshSelectWeights3(word *t,int nVars,int *pW)

{
  int iVar1;
  int iVar2;
  int local_34;
  int nMints;
  int Lmax;
  int Lmin;
  int m;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 3) {
    __assert_fail("nVars == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                  ,0xa3,"int Extra_ThreshSelectWeights3(word *, int, int *)");
  }
  pW[2] = 1;
  do {
    if (3 < pW[2]) {
      return 0;
    }
    pW[1] = pW[2];
    while (pW[1] < 4) {
      *pW = pW[1];
      while (*pW < 4) {
        nMints = 10000;
        local_34 = 0;
        for (Lmax = 0; Lmax < iVar1; Lmax = Lmax + 1) {
          iVar2 = Abc_TtGetBit(t,Lmax);
          if (iVar2 == 0) {
            iVar2 = Extra_ThreshWeightedSum(pW,3,Lmax);
            local_34 = Abc_MaxInt(local_34,iVar2);
          }
          else {
            iVar2 = Extra_ThreshWeightedSum(pW,3,Lmax);
            nMints = Abc_MinInt(nMints,iVar2);
          }
          if (nMints <= local_34) break;
        }
        if (iVar1 <= Lmax) {
          if (local_34 < nMints) {
            return nMints;
          }
          __assert_fail("Lmax < Lmin",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                        ,0xb7,"int Extra_ThreshSelectWeights3(word *, int, int *)");
        }
        *pW = *pW + 1;
      }
      pW[1] = pW[1] + 1;
    }
    pW[2] = pW[2] + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights3(word * t, int nVars, int * pW) {
	int m, Lmin, Lmax, nMints = (1 << nVars);
	assert(nVars == 3);
	for (pW[2] = 1; pW[2] <= nVars; pW[2]++)
		for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
			for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
				Lmin = 10000;
				Lmax = 0;
				for (m = 0; m < nMints; m++) {
					if (Abc_TtGetBit(t, m))
						Lmin = Abc_MinInt(Lmin,
								Extra_ThreshWeightedSum(pW, nVars, m));
					else
						Lmax = Abc_MaxInt(Lmax,
								Extra_ThreshWeightedSum(pW, nVars, m));
					if (Lmax >= Lmin)
						break;
//            printf( "%c%d ", Abc_TtGetBit(t, m) ? '+' : '-', Extra_ThreshWeightedSum(pW, nVars, m) );
				}
//        printf( "  -%d +%d\n", Lmax, Lmin );
				if (m < nMints)
					continue;
				assert(Lmax < Lmin);
				return Lmin;
			}
	return 0;
}